

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_get_flow_control(cio_uart *port,cio_uart_flow_control *flow_control)

{
  _Bool _Var1;
  undefined1 local_5c [4];
  cio_error err;
  termios tty;
  cio_uart_flow_control *flow_control_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty._52_8_ = flow_control;
    port_local._4_4_ = get_current_settings(port,(termios *)local_5c);
    if (port_local._4_4_ == CIO_SUCCESS) {
      _Var1 = cts_rts_enabled(tty.c_iflag);
      if ((_Var1) || (_Var1 = xon_xoff_enabled((tcflag_t)local_5c), _Var1)) {
        _Var1 = cts_rts_enabled(tty.c_iflag);
        if ((!_Var1) || (_Var1 = xon_xoff_enabled((tcflag_t)local_5c), _Var1)) {
          _Var1 = cts_rts_enabled(tty.c_iflag);
          if ((_Var1) || (_Var1 = xon_xoff_enabled((tcflag_t)local_5c), !_Var1)) {
            return CIO_PROTOCOL_NOT_SUPPORTED;
          }
          *(undefined4 *)tty._52_8_ = 2;
        }
        else {
          *(undefined4 *)tty._52_8_ = 1;
        }
      }
      else {
        *(undefined4 *)tty._52_8_ = 0;
      }
      port_local._4_4_ = CIO_SUCCESS;
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_get_flow_control(const struct cio_uart *port, enum cio_uart_flow_control *flow_control)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if (!cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_NONE;
	} else if (cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_RTS_CTS;
	} else if (!cts_rts_enabled(tty.c_cflag) && xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_XON_XOFF;
	} else {
		return CIO_PROTOCOL_NOT_SUPPORTED;
	}

	return CIO_SUCCESS;
}